

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O0

void __thiscall create::Serial::onData(Serial *this,error_code *e,size_t *size)

{
  bool bVar1;
  ostream *poVar2;
  enable_shared_from_this<create::Serial> local_a0;
  code *local_90;
  undefined8 local_88;
  type local_80;
  mutable_buffer local_60 [2];
  error_code local_40 [2];
  size_t *local_20;
  size_t *size_local;
  error_code *e_local;
  Serial *this_local;
  
  local_20 = size;
  size_local = (size_t *)e;
  e_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
    poVar2 = std::operator<<(poVar2,"serial error - ");
    boost::system::error_code::message_abi_cxx11_(local_40);
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    if (*local_20 == 1) {
      (*this->_vptr_Serial[1])(this,(ulong)this->byteRead);
    }
    local_60[0] = (mutable_buffer)boost::asio::buffer(&this->byteRead,1);
    local_90 = onData;
    local_88 = 0;
    std::enable_shared_from_this<create::Serial>::shared_from_this(&local_a0);
    std::
    bind<void(create::Serial::*)(boost::system::error_code_const&,unsigned_long_const&),std::shared_ptr<create::Serial>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_80,(offset_in_Serial_to_subr *)&local_90,
               (shared_ptr<create::Serial> *)&local_a0,(_Placeholder<1> *)&std::placeholders::_1,
               (_Placeholder<2> *)&std::placeholders::_2);
    boost::asio::
    async_read<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(create::Serial::*(std::shared_ptr<create::Serial>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long_const&)>>
              (&this->port,(mutable_buffers_1 *)local_60,&local_80,(type *)0x0);
    std::
    _Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
    ::~_Bind(&local_80);
    std::shared_ptr<create::Serial>::~shared_ptr((shared_ptr<create::Serial> *)&local_a0);
  }
  return;
}

Assistant:

void Serial::onData(const boost::system::error_code& e, const std::size_t& size) {
    if (e) {
      CERR("[create::Serial] ", "serial error - " << e.message());
      return;
    }

    // Should have read exactly one byte
    if (size == 1) {
      processByte(byteRead);
    } // end if (size == 1)

    // Read the next byte
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));
  }